

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O3

void __thiscall
hungarian_algorithm::
HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
::subtractSmallestUncoveredElement
          (HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
           *this)

{
  long lVar1;
  ulong *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  logic_error *this_00;
  long lVar11;
  ulong uVar12;
  long lVar13;
  pointer pdVar14;
  size_t col;
  ulong uVar15;
  ulong uVar16;
  rep local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar8 = *(ulong *)this;
  if (uVar8 != 0) {
    local_70 = (this->zero_cost_).rep_;
    uVar12 = *(ulong *)&this->field_0x8;
    pdVar14 = (this->cost_matrix_).
              super__Vector_base<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = 0;
    bVar7 = false;
    do {
      uVar15 = uVar16 + 0x3f;
      if (-1 < (long)uVar16) {
        uVar15 = uVar16;
      }
      if ((*(ulong *)(*(long *)&this->field_0x10 + ((long)uVar15 >> 6) * 8 + -8 +
                     (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
           (uVar16 & 0x3f) & 1) == 0 && uVar12 != 0) {
        uVar15 = 0;
        do {
          uVar9 = uVar15 + 0x3f;
          if (-1 < (long)uVar15) {
            uVar9 = uVar15;
          }
          if ((*(ulong *)(*(long *)&this->field_0x38 + ((long)uVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar15 & 0x3f) & 1) == 0) {
            lVar4 = pdVar14[uVar15].rep_;
            if (bVar7) {
              if (lVar4 < local_70) {
                local_70 = lVar4;
              }
            }
            else {
              bVar7 = true;
              local_70 = lVar4;
            }
          }
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      uVar16 = uVar16 + 1;
      pdVar14 = pdVar14 + uVar12;
    } while (uVar16 != uVar8);
    if (bVar7) {
      uVar12 = *(ulong *)&this->field_0x8;
      lVar4 = *(long *)&this->field_0x10;
      uVar16 = 0;
      lVar11 = 0;
      do {
        if (uVar12 == 0) {
          uVar12 = 0;
        }
        else {
          uVar8 = uVar16 + 0x3f;
          if (-1 < (long)uVar16) {
            uVar8 = uVar16;
          }
          lVar5 = *(long *)&this->field_0x38;
          lVar6 = *(long *)&this->field_0x60;
          pdVar14 = (this->cost_matrix_).
                    super__Vector_base<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar15 = 0;
          do {
            uVar12 = lVar11 + uVar15;
            uVar9 = uVar15 + 0x3f;
            if (-1 < (long)uVar15) {
              uVar9 = uVar15;
            }
            uVar9 = 1L << ((byte)uVar15 & 0x3f) &
                    *(ulong *)(((long)uVar9 >> 6) * 8 + lVar5 + -8 +
                              (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) * 8);
            if ((*(ulong *)(lVar4 + ((long)uVar8 >> 6) * 8 +
                           (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8) &
                1L << ((byte)uVar16 & 0x3f)) == 0) {
              if (uVar9 == 0) {
                lVar13 = pdVar14[lVar11 + uVar15].rep_ - local_70;
                goto LAB_0011a51a;
              }
            }
            else if (uVar9 != 0) {
              lVar13 = pdVar14[lVar11 + uVar15].rep_ + local_70;
LAB_0011a51a:
              pdVar14[lVar11 + uVar15].rep_ = lVar13;
              uVar9 = uVar12 + 0x3f;
              if (-1 < (long)uVar12) {
                uVar9 = uVar12;
              }
              uVar10 = 1L << ((byte)uVar12 & 0x3f);
              lVar1 = lVar6 + ((long)uVar9 >> 6) * 8;
              lVar3 = (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
              if (lVar13 == (this->zero_cost_).rep_) {
                puVar2 = (ulong *)(lVar1 + lVar3);
                *puVar2 = *puVar2 | uVar10;
              }
              else {
                puVar2 = (ulong *)(lVar1 + lVar3);
                *puVar2 = *puVar2 & ~uVar10;
              }
            }
            uVar15 = uVar15 + 1;
            uVar12 = *(ulong *)&this->field_0x8;
          } while (uVar15 < uVar12);
          uVar8 = *(ulong *)this;
          lVar11 = lVar11 + uVar15;
        }
        uVar16 = uVar16 + 1;
        if (uVar8 <= uVar16) {
          return;
        }
      } while( true );
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Hungarian algorithm: !found_minimum; this should never happen","");
  std::logic_error::logic_error(this_00,(string *)local_50);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void subtractSmallestUncoveredElement()
  {
    // Find smallest uncovered element:
    bool found_minimum = false;
    Cost h = zero_cost_;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      if (!covered_rows_[row])
      {
        for (std::size_t col = 0; col < num_cols_; ++col)
        {
          if (!covered_cols_[col])
          {
            if (!found_minimum)
            {
              h = cost_matrix_[getIndex(row, col)];
              found_minimum = true;
            }
            else
            {
              h = std::min(h, cost_matrix_[getIndex(row, col)]);
            }
          }
        }
      }
    }

    if (!found_minimum)
    {
      throw std::logic_error("Hungarian algorithm: !found_minimum; this should never happen");
    }

    // Subtract h from each uncovered element, and add h to each doubly covered element:
    std::size_t i = 0;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      for (std::size_t col = 0; col < num_cols_; ++col, ++i)
      {
        if (covered_rows_[row] && covered_cols_[col])
        {
          cost_matrix_[i] += h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
        else if (!covered_rows_[row] && !covered_cols_[col])
        {
          cost_matrix_[i] -= h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
      }
    }
  }